

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

uint objgetap(mcmcxdef *ctx,objnum obj,prpnum prop,objnum *ornp,int inh)

{
  short sVar1;
  int iVar2;
  uchar *puVar3;
  undefined1 *in_RCX;
  short in_DX;
  prpdef *p;
  objdef *objptr;
  prpnum prvprop;
  objnum orn;
  dattyp typ;
  uint retval;
  dattyp *in_stack_00000068;
  int in_stack_00000074;
  objnum *in_stack_00000078;
  prpnum in_stack_00000084;
  objnum in_stack_00000086;
  mcmcxdef *in_stack_00000088;
  undefined6 in_stack_ffffffffffffffb8;
  mcmon in_stack_ffffffffffffffbe;
  errcxdef *in_stack_ffffffffffffffc0;
  mcmon objnum;
  errcxdef *in_stack_ffffffffffffffc8;
  undefined1 local_26 [2];
  int local_24;
  uint local_20;
  undefined1 *local_18;
  short local_c;
  
  local_18 = in_RCX;
  local_c = in_DX;
  if (in_RCX == (undefined1 *)0x0) {
    local_18 = local_26;
  }
  do {
    objnum = (mcmon)((ulong)in_stack_ffffffffffffffc0 >> 0x30);
    local_20 = objgetap0(in_stack_00000088,in_stack_00000086,in_stack_00000084,in_stack_00000078,
                         in_stack_00000074,in_stack_00000068);
    sVar1 = local_c;
    if ((local_20 == 0) || (local_24 != 0xf)) {
      return local_20;
    }
    puVar3 = mcmlck((mcmcxdef *)in_stack_ffffffffffffffc8,objnum);
    if (local_20 == 0) {
      in_stack_ffffffffffffffc0 = (errcxdef *)0x0;
    }
    else {
      in_stack_ffffffffffffffc0 = (errcxdef *)(puVar3 + local_20);
    }
    in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc0;
    iVar2 = osrp2((uchar *)((long)&in_stack_ffffffffffffffc0->errcxptr + 6));
    local_c = (short)iVar2;
    mcmunlck((mcmcxdef *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
  } while (local_c != sVar1);
  errsigf(in_stack_ffffffffffffffc0,
          (char *)CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8),0);
}

Assistant:

uint objgetap(mcmcxdef *ctx, noreg objnum obj, prpnum prop,
              objnum *ornp, int inh)
{
    uint    retval;
    dattyp  typ;
    objnum  orn;

    /* 
     *   even if the caller doesn't care about the original object number,
     *   we do, so provide our own location to store it if necessary 
     */
    if (ornp == 0)
        ornp = &orn;

    /* keep going until we've finished translating synonyms */
    for (;;)
    {
        /* look up the property */
        retval = objgetap0(ctx, obj, prop, ornp, inh, &typ);
        
        /* 
         *   If we found something (i.e., retval != 0), check to see if we
         *   have a synonym; if so, synonym translation is required 
         */
        if (retval != 0 && typ == DAT_SYN)
        {
            prpnum  prvprop;
            objdef *objptr;
            prpdef *p;

            /* 
             *   Translation is required - get new property and try again.
             *   First, remember the original property, so we can make
             *   sure we're not going to loop (at least, not in this one
             *   synonym definition).  
             */
            prvprop = prop;

            objptr = (objdef *)mcmlck(ctx, (mcmon)*ornp);
            p = objofsp(objptr, retval);
            prop = osrp2(prpvalp(p));
            mcmunlck(ctx, (mcmon)*ornp);

            /* check for direct circularity */
            if (prop == prvprop)
                errsig(ctx->mcmcxgl->mcmcxerr, ERR_CIRCSYN);

            /* go back for another try with the new property */
            continue;
        }

        /* we don't have to perform a translation; return the result */
        return retval;
    }
}